

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O0

copy_ptr<cppcms::form::iterator::_data> * __thiscall
booster::copy_ptr<cppcms::form::iterator::_data>::operator=
          (copy_ptr<cppcms::form::iterator::_data> *this,
          copy_ptr<cppcms::form::iterator::_data> *other)

{
  copy_ptr<cppcms::form::iterator::_data> *in_RSI;
  copy_ptr<cppcms::form::iterator::_data> *in_RDI;
  copy_ptr<cppcms::form::iterator::_data> tmp;
  copy_ptr<cppcms::form::iterator::_data> in_stack_ffffffffffffffe8;
  
  if (in_RDI != in_RSI) {
    copy_ptr(in_RSI,(copy_ptr<cppcms::form::iterator::_data> *)in_stack_ffffffffffffffe8.ptr_);
    swap(in_RDI,(copy_ptr<cppcms::form::iterator::_data> *)&stack0xffffffffffffffe8);
    ~copy_ptr(in_RDI);
  }
  return in_RDI;
}

Assistant:

copy_ptr const &operator=(copy_ptr const &other)
		{
			if(this != &other) {
				copy_ptr tmp(other);
				swap(tmp);
			}
			return *this;
		}